

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_objects.hh
# Opt level: O1

void __thiscall
tchecker::
intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
::reset(intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
        *this,make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL> *t)

{
  make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL> *pmVar1;
  long lVar2;
  underflow_error *this_00;
  code *pcVar3;
  undefined *puVar4;
  
  if ((t != (make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL> *)0x0) &&
     (lVar2 = *(long *)&t[-1].field_0x10 + 1, *(long *)&t[-1].field_0x10 = lVar2, lVar2 == -2)) {
    this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error((overflow_error *)this_00,"reference counter overflow");
    puVar4 = &std::overflow_error::typeinfo;
    pcVar3 = std::overflow_error::~overflow_error;
LAB_00135b6b:
    __cxa_throw(this_00,puVar4,pcVar3);
  }
  pmVar1 = this->_t;
  if (pmVar1 != (make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL> *)0x0) {
    if (*(long *)&pmVar1[-1].field_0x10 == 0) {
      this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
      std::underflow_error::underflow_error(this_00,"reference counter underflow");
      puVar4 = &std::underflow_error::typeinfo;
      pcVar3 = std::underflow_error::~underflow_error;
      goto LAB_00135b6b;
    }
    *(long *)&pmVar1[-1].field_0x10 = *(long *)&pmVar1[-1].field_0x10 + -1;
  }
  this->_t = t;
  return;
}

Assistant:

inline void reset(T * t = nullptr)
  {
    if (t != nullptr)
      t->take_reference();
    if (_t != nullptr)
      _t->release_reference();
    _t = t;
  }